

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O2

void __thiscall irr::video::CImage::setPixel(CImage *this,u32 x,u32 y,SColor *color,bool blend)

{
  ECOLOR_FORMAT EVar1;
  u16 uVar2;
  u32 uVar3;
  ulong uVar4;
  uint uVar5;
  u8 *puVar6;
  double in_XMM0_Qa;
  
  if ((this->super_IImage).Size.Width <= x) {
    return;
  }
  if ((this->super_IImage).Size.Height <= y) {
    return;
  }
  EVar1 = (this->super_IImage).Format;
  switch(EVar1) {
  case ECF_A1R5G5B5:
    puVar6 = (this->super_IImage).Data + y * (this->super_IImage).Pitch;
    uVar2 = A8R8G8B8toA1R5G5B5(color->color);
    goto LAB_00215942;
  case ECF_R5G6B5:
    puVar6 = (this->super_IImage).Data + y * (this->super_IImage).Pitch;
    uVar2 = A8R8G8B8toR5G6B5(color->color);
LAB_00215942:
    *(u16 *)(puVar6 + x * 2) = uVar2;
    break;
  case ECF_R8G8B8:
    uVar5 = y * (this->super_IImage).Pitch;
    puVar6 = (this->super_IImage).Data;
    uVar4 = (ulong)(x * 3);
    puVar6[uVar4 + uVar5] = *(u8 *)((long)&color->color + 2);
    puVar6[uVar4 + 1 + (ulong)uVar5] = *(u8 *)((long)&color->color + 1);
    puVar6[uVar4 + 2 + (ulong)uVar5] = (u8)color->color;
    break;
  case ECF_A8R8G8B8:
    uVar5 = y * (this->super_IImage).Pitch;
    puVar6 = (this->super_IImage).Data;
    if (blend) {
      uVar3 = PixelBlend32(*(u32 *)(puVar6 + (ulong)(x << 2) + (ulong)uVar5),color->color);
    }
    else {
      uVar3 = color->color;
    }
    *(u32 *)(puVar6 + (ulong)(x << 2) + (ulong)uVar5) = uVar3;
    break;
  default:
    if (EVar1 == ECF_UNKNOWN) {
      os::Printer::log((Printer *)"IImage::setPixel unknown format.",in_XMM0_Qa);
      return;
    }
  }
  return;
}

Assistant:

void CImage::setPixel(u32 x, u32 y, const SColor &color, bool blend)
{
	if (x >= Size.Width || y >= Size.Height)
		return;

	switch (Format) {
	case ECF_A1R5G5B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toA1R5G5B5(color.color);
	} break;

	case ECF_R5G6B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toR5G6B5(color.color);
	} break;

	case ECF_R8G8B8: {
		u8 *dest = Data + (y * Pitch) + (x * 3);
		dest[0] = (u8)color.getRed();
		dest[1] = (u8)color.getGreen();
		dest[2] = (u8)color.getBlue();
	} break;

	case ECF_A8R8G8B8: {
		u32 *dest = (u32 *)(Data + (y * Pitch) + (x << 2));
		*dest = blend ? PixelBlend32(*dest, color.color) : color.color;
	} break;

	case ECF_UNKNOWN:
		os::Printer::log("IImage::setPixel unknown format.", ELL_WARNING);
		return;

	default:
		break;
	}
}